

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O1

void __thiscall
aeron::util::SourcedException::SourcedException
          (SourcedException *this,string *what,string *function,string *file,int line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pcVar3;
  undefined8 uVar4;
  string *psVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  uint uVar9;
  long *plVar10;
  ulong *puVar11;
  ulong uVar12;
  uint __val;
  uint __len;
  string __str;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68;
  long lStack_60;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string *local_38;
  
  *(undefined ***)this = &PTR__SourcedException_0015e330;
  local_98[0] = local_88;
  pcVar3 = (function->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_98,pcVar3,pcVar3 + function->_M_string_length);
  std::__cxx11::string::append((char *)local_98);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_98,(ulong)(file->_M_dataplus)._M_p)
  ;
  local_58 = &local_48;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_48 = *plVar10;
    lStack_40 = plVar7[3];
  }
  else {
    local_48 = *plVar10;
    local_58 = (long *)*plVar7;
  }
  local_50 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_58);
  puVar11 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar11) {
    local_68 = *puVar11;
    lStack_60 = plVar7[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *puVar11;
    local_78 = (ulong *)*plVar7;
  }
  local_70 = plVar7[1];
  *plVar7 = (long)puVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  __val = -line;
  if (0 < line) {
    __val = line;
  }
  __len = 1;
  if (9 < __val) {
    uVar12 = (ulong)__val;
    uVar6 = 4;
    do {
      __len = uVar6;
      uVar9 = (uint)uVar12;
      if (uVar9 < 100) {
        __len = __len - 2;
        goto LAB_0012488b;
      }
      if (uVar9 < 1000) {
        __len = __len - 1;
        goto LAB_0012488b;
      }
      if (uVar9 < 10000) goto LAB_0012488b;
      uVar12 = uVar12 / 10000;
      uVar6 = __len + 4;
    } while (99999 < uVar9);
    __len = __len + 1;
  }
LAB_0012488b:
  local_b8 = local_a8;
  local_38 = what;
  std::__cxx11::string::_M_construct((ulong)&local_b8,(char)__len - (char)(line >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)line >> 0x1f) + (long)local_b8),__len,__val);
  uVar12 = 0xf;
  if (local_78 != &local_68) {
    uVar12 = local_68;
  }
  if (uVar12 < (ulong)(local_b0 + local_70)) {
    uVar12 = 0xf;
    if (local_b8 != local_a8) {
      uVar12 = local_a8[0];
    }
    if ((ulong)(local_b0 + local_70) <= uVar12) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_78);
      goto LAB_0012491d;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_b8);
LAB_0012491d:
  paVar1 = &(this->m_where).field_2;
  (this->m_where)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = puVar8 + 2;
  if ((size_type *)*puVar8 == psVar2) {
    uVar4 = puVar8[3];
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->m_where).field_2 + 8) = uVar4;
  }
  else {
    (this->m_where)._M_dataplus._M_p = (pointer)*puVar8;
    (this->m_where).field_2._M_allocated_capacity = *psVar2;
  }
  (this->m_where)._M_string_length = puVar8[1];
  *puVar8 = psVar2;
  puVar8[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  psVar5 = local_38;
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  (this->m_what)._M_dataplus._M_p = (pointer)&(this->m_what).field_2;
  pcVar3 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_what,pcVar3,pcVar3 + psVar5->_M_string_length);
  return;
}

Assistant:

SourcedException(const std::string &what, const std::string& function, const std::string& file, const int line) :
        m_where(function + " : " + file + " : " + std::to_string(line)),
        m_what(what)
    {
    }